

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_class_spell(parser *p)

{
  int iVar1;
  wchar_t wVar2;
  parser_error pVar3;
  void *pvVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar2 = *(wchar_t *)((long)pvVar4 + 0x108);
    pVar3 = PARSE_ERROR_TOO_MANY_ENTRIES;
    if (0 < (long)wVar2) {
      lVar8 = *(long *)((long)pvVar4 + 0x110);
      if ((lVar8 == 0) || (class_max_books < wVar2)) {
        __assert_fail("c->magic.books && c->magic.num_books <= class_max_books",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/init.c"
                      ,0xfa1,"enum parser_error parse_class_spell(struct parser *)");
      }
      lVar6 = (long)wVar2 * 0x20;
      wVar2 = *(wchar_t *)(lVar8 + -0x14 + lVar6);
      if (wVar2 < book_max_spells) {
        if (L'\xffffffff' < wVar2) {
          lVar8 = lVar8 + lVar6;
          lVar6 = *(long *)(lVar8 + -8);
          if (lVar6 != 0) {
            lVar7 = (ulong)(uint)wVar2 * 0x38;
            *(undefined8 *)(lVar6 + 0x18 + lVar7) = *(undefined8 *)(lVar8 + -0x10);
            pcVar5 = parser_getsym(p,"name");
            pcVar5 = string_make(pcVar5);
            *(char **)(lVar6 + lVar7) = pcVar5;
            iVar1 = *(int *)((long)pvVar4 + 0x118);
            *(int *)(lVar6 + 0x20 + lVar7) = iVar1;
            *(int *)((long)pvVar4 + 0x118) = iVar1 + 1;
            *(int *)(lVar6 + 0x24 + lVar7) = *(int *)((long)pvVar4 + 0x108) + -1;
            wVar2 = parser_getint(p,"level");
            *(wchar_t *)(lVar6 + 0x28 + lVar7) = wVar2;
            wVar2 = parser_getint(p,"mana");
            *(wchar_t *)(lVar6 + 0x2c + lVar7) = wVar2;
            wVar2 = parser_getint(p,"fail");
            *(wchar_t *)(lVar6 + 0x30 + lVar7) = wVar2;
            wVar2 = parser_getint(p,"exp");
            *(wchar_t *)(lVar6 + 0x34 + lVar7) = wVar2;
            *(int *)(lVar8 + -0x14) = *(int *)(lVar8 + -0x14) + 1;
            return PARSE_ERROR_NONE;
          }
        }
        __assert_fail("book->spells && book->num_spells >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/init.c"
                      ,0xfa6,"enum parser_error parse_class_spell(struct parser *)");
      }
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_class_spell(struct parser *p) {
	struct player_class *c = parser_priv(p);
	struct class_book *book;
	struct class_spell *spell;

	if (!c) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (c->magic.num_books < 1) {
		/*
		 * Either missing a magic directive for the class or didn't
		 * have a book directive after the magic directive.  Use
		 * this under the assumption that without those, the maximum
		 * number of spells is zero.
		 */
		return PARSE_ERROR_TOO_MANY_ENTRIES;
	}
	assert(c->magic.books && c->magic.num_books <= class_max_books);
	book = &c->magic.books[c->magic.num_books - 1];
	if (book->num_spells >= book_max_spells) {
		return PARSE_ERROR_TOO_MANY_ENTRIES;
	}
	assert(book->spells && book->num_spells >= 0);
	spell = &book->spells[book->num_spells];
	spell->realm = book->realm;
	spell->name = string_make(parser_getsym(p, "name"));
	spell->sidx = c->magic.total_spells;
	c->magic.total_spells++;
	spell->bidx = c->magic.num_books - 1;
	spell->slevel = parser_getint(p, "level");
	spell->smana = parser_getint(p, "mana");
	spell->sfail = parser_getint(p, "fail");
	spell->sexp = parser_getint(p, "exp");
	++book->num_spells;
	return PARSE_ERROR_NONE;
}